

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLargeDataWindowOffsets.cpp
# Opt level: O0

ChannelList *
anon_unknown.dwarf_13f597::setupBuffer
          (Header *hdr,char **channels,PixelType *pt,FrameBuffer *buf,bool writing)

{
  int iVar1;
  int iVar2;
  Channel *pCVar3;
  Slice *pSVar4;
  char *pcVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  long in_RCX;
  long in_RDX;
  ChannelList *in_RDI;
  char *in_R8;
  byte in_R9B;
  float fVar10;
  undefined1 auVar11 [16];
  PixelType type;
  size_t i_1;
  char *offset;
  int64_t bytes_per_row;
  int64_t width;
  unsigned_short values;
  half v;
  size_t i;
  size_t chan;
  char *write_ptr;
  size_t size;
  size_t samples;
  size_t activechans;
  Box2i dw;
  ChannelList *chanlist;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffe88;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  PixelType local_12c;
  Vec2 *local_128;
  float *local_120;
  undefined1 local_f8 [76];
  Channel local_ac [16];
  PixelType local_9c;
  ulong local_98;
  Vec2 *local_90;
  long local_88;
  long local_80;
  undefined1 local_77;
  uint16_t local_76;
  uint16_t local_74;
  half local_72;
  ulong local_70;
  ulong local_68;
  float *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  int local_3c [2];
  int local_34;
  byte local_29;
  char *local_28;
  long local_20;
  long local_18;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  for (local_48 = 0; *(long *)(local_18 + local_48 * 8) != 0; local_48 = local_48 + 1) {
  }
  lVar8 = Imf_3_4::Header::dataWindow();
  iVar7 = *(int *)(lVar8 + 8);
  piVar9 = (int *)Imf_3_4::Header::dataWindow();
  iVar1 = *piVar9;
  lVar8 = Imf_3_4::Header::dataWindow();
  iVar2 = *(int *)(lVar8 + 0xc);
  lVar8 = Imf_3_4::Header::dataWindow();
  local_50 = (long)((iVar7 + 1) - iVar1) * (long)((iVar2 + 1) - *(int *)(lVar8 + 4)) * local_48;
  local_58 = local_50 * 4;
  if ((local_29 & 1) == 0) {
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  else {
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  if ((local_29 & 1) == 0) {
    local_120 = (float *)std::vector<char,_std::allocator<char>_>::operator[]
                                   ((vector<char,_std::allocator<char>_> *)
                                    (anonymous_namespace)::readingBuffer,0);
  }
  else {
    local_120 = (float *)std::vector<char,_std::allocator<char>_>::operator[]
                                   ((vector<char,_std::allocator<char>_> *)
                                    (anonymous_namespace)::writingBuffer,0);
  }
  local_60 = local_120;
  local_68 = 0;
  for (local_70 = 0; local_70 < local_50; local_70 = local_70 + 1) {
    do {
      std::numeric_limits<unsigned_short>::max();
      iVar7 = random_int((int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
      local_74 = (uint16_t)iVar7;
      Imath_3_2::half::setBits(&local_72,local_74);
      bVar6 = Imath_3_2::half::isNan((half *)in_stack_fffffffffffffe90);
    } while (bVar6);
    if ((local_20 == 0) || (*(int *)(local_20 + local_68 * 4) == 1)) {
      local_76 = local_72._h;
      *(uint16_t *)local_60 = local_72._h;
    }
    else {
      fVar10 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffe90);
      *local_60 = fVar10;
    }
    local_68 = local_68 + 1;
    local_60 = local_60 + 1;
    if (local_68 == local_48) {
      local_68 = 0;
    }
  }
  local_77 = 0;
  Imf_3_4::ChannelList::ChannelList((ChannelList *)0x1af125);
  local_80 = (long)((local_34 + 1) - local_3c[0]);
  local_88 = local_48 * 4 * local_80;
  if ((local_29 & 1) == 0) {
    local_128 = (Vec2 *)std::vector<char,_std::allocator<char>_>::data
                                  ((vector<char,_std::allocator<char>_> *)0x1af186);
  }
  else {
    local_128 = (Vec2 *)std::vector<char,_std::allocator<char>_>::data
                                  ((vector<char,_std::allocator<char>_> *)0x1af173);
  }
  local_90 = local_128;
  for (local_98 = 0; local_98 < local_48; local_98 = local_98 + 1) {
    if (local_20 == 0) {
      local_12c = HALF;
    }
    else {
      local_12c = *(PixelType *)(local_20 + local_98 * 4);
    }
    local_9c = local_12c;
    pCVar3 = *(Channel **)(local_18 + local_98 * 8);
    Imf_3_4::Channel::Channel(local_ac,local_12c,1,1,false);
    Imf_3_4::ChannelList::insert((char *)in_RDI,pCVar3);
    pcVar5 = local_28;
    pSVar4 = *(Slice **)(local_18 + local_98 * 8);
    auVar11._8_4_ = (int)(local_98 >> 0x20);
    auVar11._0_8_ = local_98;
    auVar11._12_4_ = 0x45300000;
    Imf_3_4::Slice::Make
              ((PixelType)local_f8,(void *)(ulong)local_9c,local_90,(long)local_3c,local_80,1,
               local_48 << 2,(int)local_88,1,
               (auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_98) - 4503599627370496.0) + 100.0,true,false)
    ;
    Imf_3_4::FrameBuffer::insert(pcVar5,pSVar4);
    local_90 = local_90 + 4;
  }
  return in_RDI;
}

Assistant:

ChannelList
setupBuffer (
    const Header&      hdr,      // header to grab datawindow from
    const char* const* channels, // NULL terminated list of channels to write
    const PixelType*   pt,
    FrameBuffer&       buf,    // buffer to fill with pointers to channel
    bool               writing // true if should allocate
)
{
    Box2i dw = hdr.dataWindow ();

    //
    // how many channels in total
    //
    size_t activechans = 0;

    while (channels[activechans] != NULL)
    {
        activechans++;
    }

    size_t samples =
        size_t (hdr.dataWindow ().max.x + 1 - hdr.dataWindow ().min.x) *
        size_t (hdr.dataWindow ().max.y + 1 - hdr.dataWindow ().min.y) *
        activechans;

    // always allocate four bytes for each sample, even half types. to keep floats word-aligned
    size_t size = samples * 4;

    if (writing) { writingBuffer.resize (size); }
    else { readingBuffer.resize (size); }

    const char* write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
    // fill with random halves, casting to floats for float channels - don't write NaN values
    size_t chan = 0;
    for (size_t i = 0; i < samples; i++)
    {

        half v;
        do
        {
            unsigned short int values =
                random_int (std::numeric_limits<unsigned short>::max ());
            v.setBits (values);
        } while (v.isNan ());

        if (pt == NULL || pt[chan] == IMF::HALF)
        {
            *(half*) write_ptr = half (v);
        }
        else { *(float*) write_ptr = float (v); }
        chan++;
        write_ptr += 4;
        if (chan == activechans) { chan = 0; }
    }

    ChannelList chanlist;

    int64_t width         = (dw.max.x + 1 - dw.min.x);
    int64_t bytes_per_row = activechans * 4 * width;

    const char* offset =
        (writing ? writingBuffer.data () : readingBuffer.data ());
    for (size_t i = 0; i < activechans; i++)
    {
        PixelType type = pt == NULL ? IMF::HALF : pt[i];

        chanlist.insert (channels[i], type);
        buf.insert (
            channels[i],
            Slice::Make (
                type,
                offset,
                dw.min,
                width,
                1,
                activechans * 4,
                bytes_per_row,
                1,
                1,
                100. + i,
                false,
                false));
        offset += 4;
    }

    return chanlist;
}